

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateInfoLoadFromString(HelicsFederateInfo fedInfo,char *args,HelicsError *err)

{
  FederateInfo *this;
  bool bVar1;
  allocator<char> local_49;
  string local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (fedInfo == (HelicsFederateInfo)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a03f3;
    }
    else {
      bVar1 = *(int *)((long)fedInfo + 0x48) == 0x6bfbbce1;
      this = (FederateInfo *)0x0;
      if (bVar1) {
        this = (FederateInfo *)fedInfo;
      }
      if (bVar1 || err == (HelicsError *)0x0) goto LAB_001a03f6;
    }
    err->error_code = -3;
    err->message = "helics Federate info object was not valid";
  }
LAB_001a03f3:
  this = (FederateInfo *)0x0;
LAB_001a03f6:
  if (this != (FederateInfo *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,args,&local_49);
    helics::FederateInfo::loadInfoFromArgs(&local_28,this,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void helicsFederateInfoLoadFromString(HelicsFederateInfo fedInfo, const char* args, HelicsError* err)
{
    auto* info = getFedInfo(fedInfo, err);
    if (info == nullptr) {
        return;
    }
    try {
        info->loadInfoFromArgs(args);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}